

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O3

void __thiscall HSlider::draw(HSlider *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  uint uVar6;
  Theme *pTVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  SaveState state;
  undefined1 local_418 [1024];
  
  uVar11 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  pTVar7 = ((this->super_Widget).dialog)->theme;
  iVar9 = (this->super_Widget).y2;
  iVar5 = (this->super_Widget).y1;
  al_store_state(local_418,0xffff);
  uVar12._0_4_ = (pTVar7->bg).r;
  uVar12._4_4_ = (pTVar7->bg).g;
  uVar13._0_4_ = (pTVar7->bg).b;
  uVar13._4_4_ = (pTVar7->bg).a;
  iVar8 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  if ((char)iVar8 != '\0') {
    uVar12 = al_map_rgb(0x40,0x40,0x40);
    uVar13 = in_XMM1_Qa;
  }
  al_draw_filled_rectangle
            ((float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
             CONCAT44(uVar11,(float)(this->super_Widget).x2),(float)(this->super_Widget).y2,uVar12,
             uVar13);
  fVar10 = (float)((iVar9 + iVar5) / 2);
  uVar1._0_4_ = (pTVar7->fg).r;
  uVar1._4_4_ = (pTVar7->fg).g;
  uVar2._0_4_ = (pTVar7->fg).b;
  uVar2._4_4_ = (pTVar7->fg).a;
  al_draw_line((float)(this->super_Widget).x1,fVar10,(float)(this->super_Widget).x2,fVar10,uVar1,
               uVar2,0);
  uVar12 = *(undefined8 *)&(this->super_Widget).field_0x34;
  uVar6 = (this->super_Widget).x1;
  iVar9 = (int)((double)(~uVar6 + (this->super_Widget).x2) *
               ((double)(int)uVar12 / (double)(int)((ulong)uVar12 >> 0x20)));
  uVar3._0_4_ = (pTVar7->fg).r;
  uVar3._4_4_ = (pTVar7->fg).g;
  uVar4._0_4_ = (pTVar7->fg).b;
  uVar4._4_4_ = (pTVar7->fg).a;
  al_draw_filled_rectangle
            ((float)(int)((uVar6 - 2) + iVar9),(float)(this->super_Widget).y1,
             (float)(int)(uVar6 + 2 + iVar9),(float)(this->super_Widget).y2,uVar3,uVar4);
  al_restore_state(local_418);
  return;
}

Assistant:

void HSlider::draw()
{
   const Theme & theme = dialog->get_theme();
   const int cy = (y1 + y2) / 2;
   SaveState state;
   ALLEGRO_COLOR bg = theme.bg;

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(x1, y1, x2, y2, bg);
   al_draw_line(x1, cy, x2, cy, theme.fg, 0);

   double ratio = (double) this->cur_value / (double) this->max_value;
   int xpos = x1 + (int) (ratio * (width() - 2));
   al_draw_filled_rectangle(xpos - 2, y1, xpos + 2, y2, theme.fg);
}